

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-defend.c
# Opt level: O0

_Bool borg_defend(wchar_t p1)

{
  _Bool _Var1;
  wchar_t wVar2;
  char *pcVar3;
  wchar_t local_20;
  wchar_t p;
  wchar_t b_g;
  wchar_t g;
  wchar_t b_n;
  wchar_t n;
  wchar_t p1_local;
  
  b_g = L'\0';
  local_20 = L'\xffffffff';
  borg_simulate = true;
  if ((borg.resistance != 0) &&
     (SBORROW4((int)borg.resistance,borg_game_ratio * 2) !=
      (int)borg.resistance + borg_game_ratio * -2 < 0)) {
    borg_attacking = true;
    wVar2 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
    borg_attacking = false;
    if ((((int)(uint)borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb] < wVar2) ||
        (borg_fighting_unique != L'\0')) && (_Var1 = borg_spell(RESISTANCE), _Var1)) {
      pcVar3 = format("# Refreshing Resistance.  borg.resistance=%d, player->=%d, (ratio=%d)",
                      (ulong)(uint)(int)borg.resistance,(ulong)(uint)(int)player->timed[0x13],
                      (ulong)(uint)(int)borg_game_ratio);
      borg_note(pcVar3);
      borg_attempting_refresh_resist = true;
      borg.resistance = 25000;
      return true;
    }
  }
  for (p = L'\0'; p < L' '; p = p + L'\x01') {
    wVar2 = borg_calculate_defense_effectiveness(p,p1);
    if (b_g < wVar2) {
      local_20 = p;
      b_g = wVar2;
    }
  }
  if (L'\0' < b_g) {
    pcVar3 = format("# Performing defense type %d with value %d",(ulong)(uint)local_20,
                    (ulong)(uint)b_g);
    borg_note(pcVar3);
    borg_simulate = false;
    borg_calculate_defense_effectiveness(local_20,p1);
  }
  return L'\0' < b_g;
}

Assistant:

bool borg_defend(int p1)
{
    int n, b_n = 0;
    int g, b_g = -1;

    /* Simulate */
    borg_simulate = true;

    /* if you have Resist All and it is about to drop, */
    /* refresh it (if you can) */
    if (borg.resistance && borg.resistance < (borg_game_ratio * 2)) {
        int p;

        /* check 'true' danger. This will make sure we do not */
        /* refresh our Resistance if no-one is around */
        borg_attacking = true;
        p              = borg_danger(
            borg.c.y, borg.c.x, 1, false, false); /* Note false for danger!! */
        borg_attacking = false;
        if (p > borg_fear_region[borg.c.y / 11][borg.c.x / 11]
            || borg_fighting_unique) {
            if (borg_spell(RESISTANCE)) {
                borg_note(format("# Refreshing Resistance.  "
                                 "borg.resistance=%d, player->=%d, (ratio=%d)",
                    borg.resistance, player->timed[TMD_OPP_ACID],
                    borg_game_ratio));
                borg_attempting_refresh_resist = true;
                borg.resistance                = 25000;
                return true;
            }
        }
    }

    /* Analyze the possible setup moves */
    for (g = 0; g < BD_MAX; g++) {
        /* Simulate */
        n = borg_calculate_defense_effectiveness(g, p1);

        /* Track "best" attack */
        if (n <= b_n)
            continue;

        /* Track best */
        b_g = g;
        b_n = n;
    }

    /* Nothing good */
    if (b_n <= 0) {
        return false;
    }

    /* Note */
    borg_note(format("# Performing defense type %d with value %d", b_g, b_n));

    /* Instantiate */
    borg_simulate = false;

    /* Instantiate */
    (void)borg_calculate_defense_effectiveness(b_g, p1);

    /* Success */
    return true;
}